

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O2

void PPC_printInst(MCInst *MI,SStream *O,void *Info)

{
  char *pcVar1;
  char *pcVar2;
  uint8_t *puVar3;
  byte bVar4;
  char cVar5;
  ushort uVar6;
  cs_detail *pcVar7;
  bool bVar8;
  bool bVar9;
  _Bool _Var10;
  uint uVar11;
  uint uVar12;
  arm64_cc aVar13;
  MCOperand *pMVar14;
  ulong uVar15;
  ulong uVar16;
  int64_t iVar17;
  int64_t iVar18;
  MCRegisterClass *pMVar19;
  char *s;
  size_t sVar20;
  uint *Modifier;
  long lVar21;
  uint OpNo;
  int v;
  char *pcVar22;
  ppc_alias alias;
  
  uVar11 = MCInst_getOpcode(MI);
  if (uVar11 == 0x3d2) {
    pMVar14 = MCInst_getOperand(MI,2);
    uVar15 = MCOperand_getImm(pMVar14);
    pMVar14 = MCInst_getOperand(MI,3);
    uVar16 = MCOperand_getImm(pMVar14);
    pMVar14 = MCInst_getOperand(MI,4);
    iVar17 = MCOperand_getImm(pMVar14);
    uVar11 = (uint)uVar15 & 0xff;
    if ((uVar16 & 0xff) == 0 && uVar11 < 0x20) {
      if (((uint)iVar17 & 0xff) != 0x1f - uVar11) goto LAB_002062f2;
      SStream_concat0(O,"slwi\t");
      MCInst_setOpcodePub(MI,0x3a5);
      bVar9 = true;
    }
    else {
      if (0x1f < uVar11) goto LAB_002063cb;
LAB_002062f2:
      bVar9 = false;
    }
    if ((char)iVar17 == '\x1f' && ((uint)uVar16 & 0xff) == 0x20 - uVar11) {
      SStream_concat0(O,"srwi\t");
      MCInst_setOpcodePub(MI,0x3a6);
      uVar15 = uVar16;
LAB_00206337:
      printOperand(MI,0,O);
      SStream_concat0(O,", ");
      printOperand(MI,1,O);
      pcVar22 = ", %u";
      if (9 < (byte)uVar15) {
        pcVar22 = ", 0x%x";
      }
      SStream_concat(O,pcVar22,uVar15 & 0xff);
      if (MI->csh->detail == CS_OPT_OFF) {
        return;
      }
      pcVar7 = MI->flat_insn->detail;
      bVar4 = (pcVar7->field_6).x86.addr_size;
      lVar21 = (ulong)bVar4 * 0x18;
      puVar3 = pcVar7->groups + lVar21 + 0x1d;
      puVar3[0] = '\x02';
      puVar3[1] = '\0';
      puVar3[2] = '\0';
      puVar3[3] = '\0';
      *(ulong *)(pcVar7->groups + lVar21 + 0x25) = uVar15 & 0xff;
      (pcVar7->field_6).x86.addr_size = bVar4 + 1;
      return;
    }
    if (bVar9) goto LAB_00206337;
  }
LAB_002063cb:
  uVar11 = MCInst_getOpcode(MI);
  if ((uVar11 == 0x302) || (uVar11 = MCInst_getOpcode(MI), uVar11 == 0x303)) {
    pMVar14 = MCInst_getOperand(MI,1);
    uVar11 = MCOperand_getReg(pMVar14);
    pMVar14 = MCInst_getOperand(MI,2);
    uVar12 = MCOperand_getReg(pMVar14);
    if (uVar11 == uVar12) {
      SStream_concat0(O,"mr\t");
      MCInst_setOpcodePub(MI,0x3f0);
      printOperand(MI,0,O);
      SStream_concat0(O,", ");
      printOperand(MI,1,O);
      return;
    }
  }
  uVar11 = MCInst_getOpcode(MI);
  if (uVar11 == 0x3c9) {
    pMVar14 = MCInst_getOperand(MI,2);
    iVar17 = MCOperand_getImm(pMVar14);
    pMVar14 = MCInst_getOperand(MI,3);
    iVar18 = MCOperand_getImm(pMVar14);
    uVar11 = (uint)iVar17 & 0xff;
    if (0x3f - uVar11 == ((uint)iVar18 & 0xff)) {
      SStream_concat0(O,"sldi\t");
      MCInst_setOpcodePub(MI,0x3a7);
      printOperand(MI,0,O);
      SStream_concat0(O,", ");
      printOperand(MI,1,O);
      if (uVar11 < 10) {
        pcVar22 = ", %u";
      }
      else {
        pcVar22 = ", 0x%x";
      }
      SStream_concat(O,pcVar22,(ulong)uVar11);
      return;
    }
  }
  uVar11 = MCInst_getOpcode(MI);
  if ((((uVar11 == 0x5e6) || (uVar11 = MCInst_getOpcode(MI), uVar11 == 0x5e7)) ||
      (uVar11 = MCInst_getOpcode(MI), uVar11 == 0x5ea)) ||
     (uVar11 = MCInst_getOpcode(MI), uVar11 == 0x5eb)) {
    pMVar14 = MCInst_getOperand(MI,2);
    iVar17 = MCOperand_getImm(pMVar14);
    pMVar14 = MCInst_getOperand(MI,2);
    MCOperand_setImm(pMVar14,(iVar17 << 0x32) >> 0x32);
  }
  uVar11 = MCInst_getOpcode(MI);
  if (0xffffffd7 < uVar11 - 0xc2) {
    pMVar14 = MCInst_getOperand(MI,0);
    _Var10 = MCOperand_isImm(pMVar14);
    if (_Var10) {
      pMVar14 = MCInst_getOperand(MI,0);
      iVar17 = MCOperand_getImm(pMVar14);
      pMVar14 = MCInst_getOperand(MI,0);
      MCOperand_setImm(pMVar14,(iVar17 << 0x32) >> 0x32);
    }
  }
  uVar11 = MCInst_getOpcode(MI);
  if (((uVar11 == 0x78) || (uVar11 = MCInst_getOpcode(MI), uVar11 == 0x79)) ||
     ((uVar11 = MCInst_getOpcode(MI), uVar11 == 0xc2 ||
      (uVar11 = MCInst_getOpcode(MI), uVar11 == 200)))) {
    pMVar14 = MCInst_getOperand(MI,0);
    iVar17 = MCOperand_getImm(pMVar14);
    pMVar14 = MCInst_getOperand(MI,0);
    MCOperand_setImm(pMVar14,(iVar17 << 0x28) >> 0x28);
  }
  SStream_Init((SStream *)&alias);
  uVar11 = MCInst_getOpcode(MI);
  if (uVar11 - 0x5e6 < 8) {
    pcVar22 = (&PTR_anon_var_dwarf_322508_00629e90)[uVar11 - 0x5e6];
    uVar11 = MCInst_getNumOperands(MI);
    bVar9 = false;
    if (uVar11 == 3) {
      bVar9 = false;
      pMVar14 = MCInst_getOperand(MI,0);
      _Var10 = MCOperand_isImm(pMVar14);
      if (_Var10) {
        bVar9 = false;
        pMVar14 = MCInst_getOperand(MI,0);
        iVar17 = MCOperand_getImm(pMVar14);
        if (-1 < iVar17) {
          bVar9 = false;
          pMVar14 = MCInst_getOperand(MI,0);
          iVar17 = MCOperand_getImm(pMVar14);
          if (iVar17 < 2) {
            SStream_concat((SStream *)&alias,pcVar22,"dnzf");
            bVar9 = true;
          }
        }
      }
    }
    uVar11 = MCInst_getNumOperands(MI);
    if (uVar11 == 3) {
      pMVar14 = MCInst_getOperand(MI,0);
      _Var10 = MCOperand_isImm(pMVar14);
      if (_Var10) {
        pMVar14 = MCInst_getOperand(MI,0);
        iVar17 = MCOperand_getImm(pMVar14);
        if (1 < iVar17) {
          pMVar14 = MCInst_getOperand(MI,0);
          iVar17 = MCOperand_getImm(pMVar14);
          if (iVar17 < 4) {
            SStream_concat((SStream *)&alias,pcVar22,"dzf");
            bVar9 = true;
          }
        }
      }
    }
    uVar11 = MCInst_getNumOperands(MI);
    if (uVar11 == 3) {
      pMVar14 = MCInst_getOperand(MI,0);
      _Var10 = MCOperand_isImm(pMVar14);
      if (_Var10) {
        pMVar14 = MCInst_getOperand(MI,0);
        iVar17 = MCOperand_getImm(pMVar14);
        if (3 < iVar17) {
          pMVar14 = MCInst_getOperand(MI,0);
          iVar17 = MCOperand_getImm(pMVar14);
          if (iVar17 < 8) {
            pMVar14 = MCInst_getOperand(MI,1);
            _Var10 = MCOperand_isReg(pMVar14);
            if (_Var10) {
              pMVar19 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,3);
              pMVar14 = MCInst_getOperand(MI,1);
              uVar11 = MCOperand_getReg(pMVar14);
              _Var10 = MCRegisterClass_contains(pMVar19,uVar11);
              if (_Var10) {
                pMVar14 = MCInst_getOperand(MI,1);
                uVar11 = MCOperand_getReg(pMVar14);
                uVar11 = (int)(uVar11 - 0x116) >> 3;
                if (uVar11 < 4) {
                  SStream_concat((SStream *)&alias,pcVar22,
                                 &DAT_003ac2bc + *(int *)(&DAT_003ac2bc + (ulong)uVar11 * 4));
                }
                bVar9 = false;
                pMVar14 = MCInst_getOperand(MI,0);
                iVar17 = MCOperand_getImm(pMVar14);
                if (iVar17 == 6) {
                  SStream_concat0((SStream *)&alias,"-");
                }
                pMVar14 = MCInst_getOperand(MI,0);
                iVar17 = MCOperand_getImm(pMVar14);
                if (iVar17 == 7) {
                  SStream_concat0((SStream *)&alias,"+");
                }
              }
            }
          }
        }
      }
    }
    uVar11 = MCInst_getNumOperands(MI);
    if (uVar11 == 3) {
      pMVar14 = MCInst_getOperand(MI,0);
      _Var10 = MCOperand_isImm(pMVar14);
      if (_Var10) {
        pMVar14 = MCInst_getOperand(MI,0);
        iVar17 = MCOperand_getImm(pMVar14);
        if (7 < iVar17) {
          pMVar14 = MCInst_getOperand(MI,0);
          iVar17 = MCOperand_getImm(pMVar14);
          if (iVar17 < 10) {
            SStream_concat((SStream *)&alias,pcVar22,"dnzt");
            bVar9 = true;
          }
        }
      }
    }
    uVar11 = MCInst_getNumOperands(MI);
    if (uVar11 == 3) {
      pMVar14 = MCInst_getOperand(MI,0);
      _Var10 = MCOperand_isImm(pMVar14);
      if (_Var10) {
        pMVar14 = MCInst_getOperand(MI,0);
        iVar17 = MCOperand_getImm(pMVar14);
        if (9 < iVar17) {
          pMVar14 = MCInst_getOperand(MI,0);
          iVar17 = MCOperand_getImm(pMVar14);
          if (iVar17 < 0xc) {
            bVar9 = true;
            SStream_concat((SStream *)&alias,pcVar22,"dzt");
          }
        }
      }
    }
    uVar11 = MCInst_getNumOperands(MI);
    if (uVar11 == 3) {
      pMVar14 = MCInst_getOperand(MI,0);
      _Var10 = MCOperand_isImm(pMVar14);
      if (_Var10) {
        pMVar14 = MCInst_getOperand(MI,0);
        iVar17 = MCOperand_getImm(pMVar14);
        if (0xb < iVar17) {
          pMVar14 = MCInst_getOperand(MI,0);
          iVar17 = MCOperand_getImm(pMVar14);
          if (iVar17 < 0x10) {
            pMVar14 = MCInst_getOperand(MI,1);
            _Var10 = MCOperand_isReg(pMVar14);
            if (_Var10) {
              pMVar19 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,3);
              pMVar14 = MCInst_getOperand(MI,1);
              uVar11 = MCOperand_getReg(pMVar14);
              _Var10 = MCRegisterClass_contains(pMVar19,uVar11);
              if (_Var10) {
                pMVar14 = MCInst_getOperand(MI,1);
                uVar11 = MCOperand_getReg(pMVar14);
                uVar11 = (int)(uVar11 - 0x116) >> 3;
                if (uVar11 < 4) {
                  SStream_concat((SStream *)&alias,pcVar22,
                                 &DAT_003ac2cc + *(int *)(&DAT_003ac2cc + (ulong)uVar11 * 4));
                }
                bVar9 = false;
                pMVar14 = MCInst_getOperand(MI,0);
                iVar17 = MCOperand_getImm(pMVar14);
                if (iVar17 == 0xe) {
                  SStream_concat0((SStream *)&alias,"-");
                }
                pMVar14 = MCInst_getOperand(MI,0);
                iVar17 = MCOperand_getImm(pMVar14);
                if (iVar17 == 0xf) {
                  SStream_concat0((SStream *)&alias,"+");
                }
              }
            }
          }
        }
      }
    }
    uVar11 = MCInst_getNumOperands(MI);
    if (uVar11 == 3) {
      pMVar14 = MCInst_getOperand(MI,0);
      _Var10 = MCOperand_isImm(pMVar14);
      if (_Var10) {
        pMVar14 = MCInst_getOperand(MI,0);
        iVar17 = MCOperand_getImm(pMVar14);
        if (((uint)iVar17 & 0x12) == 0x10) {
          SStream_concat((SStream *)&alias,pcVar22,"dnz");
          pMVar14 = MCInst_getOperand(MI,0);
          iVar17 = MCOperand_getImm(pMVar14);
          if (iVar17 == 0x18) {
            SStream_concat0((SStream *)&alias,"-");
          }
          pMVar14 = MCInst_getOperand(MI,0);
          iVar17 = MCOperand_getImm(pMVar14);
          if (iVar17 == 0x19) {
            SStream_concat0((SStream *)&alias,"+");
          }
        }
      }
    }
    uVar11 = MCInst_getNumOperands(MI);
    if (uVar11 == 3) {
      pMVar14 = MCInst_getOperand(MI,0);
      _Var10 = MCOperand_isImm(pMVar14);
      if (_Var10) {
        pMVar14 = MCInst_getOperand(MI,0);
        iVar17 = MCOperand_getImm(pMVar14);
        if ((~(uint)iVar17 & 0x12) == 0) {
          SStream_concat((SStream *)&alias,pcVar22,"dz");
          pMVar14 = MCInst_getOperand(MI,0);
          iVar17 = MCOperand_getImm(pMVar14);
          if (iVar17 == 0x1a) {
            SStream_concat0((SStream *)&alias,"-");
          }
          pMVar14 = MCInst_getOperand(MI,0);
          iVar17 = MCOperand_getImm(pMVar14);
          if (iVar17 == 0x1b) {
            SStream_concat0((SStream *)&alias,"+");
          }
        }
      }
    }
    pMVar14 = MCInst_getOperand(MI,1);
    _Var10 = MCOperand_isReg(pMVar14);
    bVar8 = true;
    if (_Var10) {
      pMVar19 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,3);
      pMVar14 = MCInst_getOperand(MI,1);
      uVar11 = MCOperand_getReg(pMVar14);
      _Var10 = MCRegisterClass_contains(pMVar19,uVar11);
      if (_Var10) {
        pMVar14 = MCInst_getOperand(MI,0);
        _Var10 = MCOperand_isImm(pMVar14);
        if (_Var10) {
          pMVar14 = MCInst_getOperand(MI,0);
          iVar17 = MCOperand_getImm(pMVar14);
          if (iVar17 < 0x10) {
            pMVar14 = MCInst_getOperand(MI,1);
            uVar11 = MCOperand_getReg(pMVar14);
            uVar11 = uVar11 + 2 & 7;
            if (bVar9) {
              SStream_concat0((SStream *)&alias," ");
              if (uVar11 != 0) {
                SStream_concat((SStream *)&alias,"4*cr%d+",(ulong)uVar11);
              }
              pMVar14 = MCInst_getOperand(MI,1);
              uVar11 = MCOperand_getReg(pMVar14);
              switch((int)(uVar11 - 0x116) >> 3) {
              case 0:
                SStream_concat0((SStream *)&alias,"eq");
                if (MI->csh->detail != CS_OPT_OFF) {
                  aVar13 = 0x4c;
LAB_00206e64:
                  (MI->flat_insn->detail->field_6).arm64.cc = aVar13;
                }
                break;
              case 1:
                SStream_concat0((SStream *)&alias,"gt");
                if (MI->csh->detail != CS_OPT_OFF) {
                  aVar13 = 0x2c;
                  goto LAB_00206e64;
                }
                break;
              case 2:
                SStream_concat0((SStream *)&alias,"lt");
                if (MI->csh->detail != CS_OPT_OFF) {
                  aVar13 = ARM64_CC_LT;
                  goto LAB_00206e64;
                }
                break;
              case 3:
                SStream_concat0((SStream *)&alias,"so");
                aVar13 = 0x8c;
                if (MI->csh->detail != CS_OPT_OFF) goto LAB_00206e64;
              }
              pMVar14 = MCInst_getOperand(MI,1);
              uVar11 = MCOperand_getReg(pMVar14);
              uVar11 = uVar11 + 2 & 7;
              if ((uVar11 != 0) && (MI->csh->detail != CS_OPT_OFF)) {
                pcVar7 = MI->flat_insn->detail;
                puVar3 = pcVar7->groups + (ulong)(pcVar7->field_6).x86.addr_size * 0x18 + 0x1d;
                puVar3[0] = '@';
                puVar3[1] = '\0';
                puVar3[2] = '\0';
                puVar3[3] = '\0';
                pcVar7 = MI->flat_insn->detail;
                puVar3 = pcVar7->groups + (ulong)(pcVar7->field_6).x86.addr_size * 0x18 + 0x25;
                puVar3[0] = '\x04';
                puVar3[1] = '\0';
                puVar3[2] = '\0';
                puVar3[3] = '\0';
                pcVar7 = MI->flat_insn->detail;
                *(uint *)(pcVar7->groups + (ulong)(pcVar7->field_6).x86.addr_size * 0x18 + 0x29) =
                     uVar11 + 2;
                pcVar7 = MI->flat_insn->detail;
                *(undefined4 *)
                 (pcVar7->groups + (ulong)(pcVar7->field_6).x86.addr_size * 0x18 + 0x2d) =
                     *(undefined4 *)(pcVar7->field_6).x86.prefix;
LAB_00206f22:
                puVar3 = &(MI->flat_insn->detail->field_6).x86.addr_size;
                *puVar3 = *puVar3 + '\x01';
              }
              bVar8 = false;
            }
            else if (uVar11 != 0) {
              bVar8 = false;
              SStream_concat((SStream *)&alias," cr%d",(ulong)uVar11);
              if (MI->csh->detail != CS_OPT_OFF) {
                pcVar7 = MI->flat_insn->detail;
                puVar3 = pcVar7->groups + (ulong)(pcVar7->field_6).x86.addr_size * 0x18 + 0x1d;
                puVar3[0] = '\x01';
                puVar3[1] = '\0';
                puVar3[2] = '\0';
                puVar3[3] = '\0';
                pcVar7 = MI->flat_insn->detail;
                *(uint *)(pcVar7->groups + (ulong)(pcVar7->field_6).x86.addr_size * 0x18 + 0x25) =
                     uVar11 + 2;
                goto LAB_00206f22;
              }
            }
          }
        }
      }
    }
    pMVar14 = MCInst_getOperand(MI,2);
    _Var10 = MCOperand_isImm(pMVar14);
    if (_Var10) {
      pMVar14 = MCInst_getOperand(MI,2);
      iVar17 = MCOperand_getImm(pMVar14);
      if (iVar17 != 0) {
        if (!bVar8) {
          SStream_concat0((SStream *)&alias,",");
        }
        SStream_concat0((SStream *)&alias,anon_var_dwarf_32293c + 4);
      }
    }
    s = cs_strdup((char *)&alias);
    for (pcVar22 = s; cVar5 = *pcVar22, cVar5 != '\0'; pcVar22 = pcVar22 + 1) {
      if ((cVar5 == ' ') || (cVar5 == '\t')) {
        *pcVar22 = '\0';
        pcVar22 = pcVar22 + 1;
        break;
      }
    }
    SStream_concat0(O,s);
    if (*pcVar22 != '\0') {
      SStream_concat0(O,anon_var_dwarf_2d61d8 + 0x11);
      do {
        cVar5 = *pcVar22;
        if (cVar5 == '$') {
          pcVar1 = pcVar22 + 1;
          if (*pcVar1 == -1) {
            pcVar1 = pcVar22 + 2;
            pcVar2 = pcVar22 + 3;
            pcVar22 = pcVar22 + 3;
            printCustomAliasOperand(MI,(int)*pcVar1 - 1,(int)*pcVar2 - 1,O);
          }
          else {
            pcVar22 = pcVar22 + 1;
            printOperand(MI,(int)*pcVar1 - 1,O);
          }
        }
        else {
          if (cVar5 == '\0') break;
          SStream_concat(O,"%c",(ulong)(uint)(int)cVar5);
        }
        pcVar22 = pcVar22 + 1;
      } while( true );
    }
    if (s != (char *)0x0) goto LAB_00207058;
  }
  s = printAliasInstr(MI,O,Info);
  if (s != (char *)0x0) {
LAB_00207058:
    if (*s != '\0') {
      sVar20 = strlen(s);
      if (((ulong)(byte)s[sVar20 - 1] < 0x2f) &&
         ((0x680000000000U >> ((ulong)(byte)s[sVar20 - 1] & 0x3f) & 1) != 0)) {
        s[sVar20 - 1] = '\0';
      }
      _Var10 = PPC_alias_insn(s,&alias);
      if ((_Var10) && (MCInst_setOpcodePub(MI,alias.id), MI->csh->detail != CS_OPT_OFF)) {
        (MI->flat_insn->detail->field_6).arm64.cc = alias.cc;
      }
    }
    (*cs_mem_free)(s);
    return;
  }
  uVar12 = MCInst_getOpcode(MI);
  uVar11 = *(uint *)(printInstruction_OpInfo + (ulong)uVar12 * 4);
  uVar6 = *(ushort *)(printInstruction_OpInfo2 + (ulong)uVar12 * 2);
  SStream_concat0(O,&UNK_003a980f + (uVar11 & 0x3fff));
  uVar12 = (uint)O;
  switch(uVar11 >> 0xe & 0xf) {
  case 1:
    OpNo = 0;
    goto LAB_002071a6;
  case 2:
    printU16ImmOperand(MI,0,O);
    break;
  case 3:
    printBranchOperand(MI,0,O);
    break;
  case 4:
    printAbsBranchOperand(MI,0,O);
    break;
  case 5:
    printPredicateOperand
              (MI,uVar12,(SStream *)0x2f4f77,(char *)&switchD_00207145::switchdataD_003a6a90);
    break;
  case 6:
    uVar11 = 0;
    goto LAB_002071f8;
  case 7:
    set_mem_access(MI,true);
    SStream_concat0(O,"(");
    printOperand(MI,1,O);
    SStream_concat0(O,")");
    set_mem_access(MI,false);
    break;
  case 8:
    uVar11 = 0;
    goto LAB_0020726b;
  case 9:
    printU5ImmOperand(MI,0,O);
    break;
  case 10:
    OpNo = 1;
LAB_002071a6:
    printOperand(MI,OpNo,O);
    break;
  case 0xb:
    printU4ImmOperand(MI,0,O);
    SStream_concat0(O,", ");
    uVar11 = 1;
    goto LAB_0020726b;
  case 0xc:
    printcrbitm(MI,0,O);
    goto LAB_0020715b;
  case 0xd:
    printU4ImmOperand(MI,1,O);
    pcVar22 = ", ";
    goto LAB_00207339;
  default:
    goto switchD_00207145_default;
  }
  Modifier = &switchD_002072a9::switchdataD_003a6ac4;
  switch(uVar11 >> 0x12 & 0x1f) {
  case 1:
    goto switchD_00207145_default;
  case 2:
    pcVar22 = " ";
    goto LAB_002073be;
  case 4:
    pcVar22 = "a";
    goto LAB_00207480;
  case 5:
    pcVar22 = "ctr";
    break;
  case 6:
    pcVar22 = "ctrl";
    break;
  case 7:
    SStream_concat0(O,"l");
  case 3:
    printPredicateOperand(MI,uVar12,(SStream *)0x5387dd,(char *)Modifier);
    SStream_concat0(O," ");
    printPredicateOperand(MI,uVar12,(SStream *)0x539592,(char *)Modifier);
    SStream_concat0(O,", ");
    goto switchD_002077ae_caseD_8;
  case 8:
    pcVar22 = "la";
LAB_00207480:
    SStream_concat0(O,pcVar22);
    printPredicateOperand(MI,uVar12,(SStream *)0x5387dd,(char *)Modifier);
    SStream_concat0(O," ");
    printPredicateOperand(MI,uVar12,(SStream *)0x539592,(char *)Modifier);
    SStream_concat0(O,", ");
    goto switchD_002077ae_caseD_9;
  case 9:
    pcVar22 = "lr";
    break;
  case 10:
    pcVar22 = "lrl";
    break;
  case 0xb:
    goto switchD_002072a9_caseD_b;
  case 0xc:
    pcVar22 = "\n\tnop";
    goto LAB_002076e7;
  case 0xd:
    SStream_concat0(O,", 268");
    v = 0x10c;
    goto LAB_0020741f;
  case 0xe:
    SStream_concat0(O,", 256");
    v = 0x100;
    goto LAB_0020741f;
  case 0xf:
    SStream_concat0(O,", 0, ");
    op_addImm(MI,0);
    goto LAB_002072ea;
  case 0x10:
    pcVar22 = ",";
LAB_00207339:
    SStream_concat0(O,pcVar22);
    goto switchD_002077ae_caseD_5;
  case 0x11:
    SStream_concat0(O,", -1");
    v = -1;
LAB_0020741f:
    op_addImm(MI,v);
    return;
  default:
    pcVar22 = ", ";
LAB_002073be:
    SStream_concat0(O,pcVar22);
    switch(uVar11 >> 0x17 & 0x1f) {
    case 1:
      uVar11 = 1;
      goto LAB_002073ee;
    case 2:
      printMemRegReg(MI,1,O);
      goto LAB_0020768d;
    case 3:
      uVar11 = 1;
      goto LAB_002073a6;
    case 4:
      uVar12 = 0;
      goto LAB_00207685;
    case 5:
      printOperand(MI,2,O);
      SStream_concat0(O,", ");
      goto LAB_0020768d;
    case 6:
      printU5ImmOperand(MI,2,O);
LAB_0020715b:
      SStream_concat0(O,", ");
LAB_002072ea:
      uVar11 = 1;
      goto LAB_00207349;
    case 7:
      uVar11 = 1;
      goto LAB_002071f8;
    case 8:
      printU5ImmOperand(MI,1,O);
      goto LAB_002075ed;
    case 9:
      printS16ImmOperand(MI,2,O);
      SStream_concat0(O,"(");
      printOperand(MI,1,O);
      pcVar22 = ")";
      goto LAB_002076e7;
    case 10:
      uVar11 = 2;
LAB_002071f8:
      printMemRegImm(MI,uVar11,O);
      break;
    case 0xb:
      uVar11 = 2;
LAB_0020726b:
      printMemRegReg(MI,uVar11,O);
      break;
    case 0xc:
      uVar11 = 1;
      goto LAB_002074f2;
    case 0xd:
      printcrbitm(MI,1,O);
      break;
    case 0xe:
      printU4ImmOperand(MI,1,O);
      break;
    case 0xf:
      uVar11 = 1;
      goto LAB_002074e6;
    case 0x10:
      pMVar14 = MCInst_getOperand(MI,1);
      iVar17 = MCOperand_getImm(pMVar14);
      printInt32(O,((int)iVar17 << 0x1b) >> 0x1b);
      if (MI->csh->detail != CS_OPT_OFF) {
        pcVar7 = MI->flat_insn->detail;
        puVar3 = pcVar7->groups + (ulong)(pcVar7->field_6).x86.addr_size * 0x18 + 0x1d;
        puVar3[0] = '\x02';
        puVar3[1] = '\0';
        puVar3[2] = '\0';
        puVar3[3] = '\0';
        pcVar7 = MI->flat_insn->detail;
        *(int64_t *)(pcVar7->groups + (ulong)(pcVar7->field_6).x86.addr_size * 0x18 + 0x25) =
             (iVar17 << 0x3b) >> 0x3b;
        puVar3 = &(MI->flat_insn->detail->field_6).x86.addr_size;
        *puVar3 = *puVar3 + '\x01';
      }
      break;
    default:
      uVar12 = 1;
LAB_00207685:
      printOperand(MI,uVar12,O);
LAB_0020768d:
      switch(uVar11 >> 0x1c) {
      case 1:
        goto switchD_00207145_default;
      case 2:
        SStream_concat0(O," ");
        printOperand(MI,3,O);
        SStream_concat0(O," ");
        uVar11 = 4;
        goto LAB_00207349;
      case 3:
        uVar11 = 0;
        break;
      case 4:
        printU6ImmOperand(MI,3,O);
        SStream_concat0(O,", ");
        uVar11 = 4;
        goto LAB_0020775e;
      case 5:
        printU5ImmOperand(MI,3,O);
        SStream_concat0(O,", ");
        printU5ImmOperand(MI,4,O);
        SStream_concat0(O,", ");
        uVar11 = 5;
        break;
      case 6:
        uVar11 = 1;
        break;
      case 7:
switchD_002072a9_caseD_b:
        pcVar22 = ", 0";
LAB_002076e7:
        SStream_concat0(O,pcVar22);
        return;
      case 8:
        uVar11 = 3;
        goto LAB_00207349;
      default:
        SStream_concat0(O,", ");
        switch(uVar6 & 0xf) {
        case 1:
          uVar11 = 2;
LAB_002074f2:
          printS16ImmOperand(MI,uVar11,O);
          break;
        case 2:
          uVar11 = 2;
LAB_002073ee:
          printU16ImmOperand(MI,uVar11,O);
          break;
        case 3:
          printU6ImmOperand(MI,2,O);
          goto LAB_0020780d;
        case 4:
          printU5ImmOperand(MI,2,O);
          goto LAB_0020780d;
        case 5:
switchD_002077ae_caseD_5:
          uVar11 = 0;
          goto LAB_00207349;
        case 6:
          uVar11 = 2;
          goto LAB_00207886;
        case 7:
          printOperand(MI,3,O);
LAB_002075ed:
          SStream_concat0(O,", ");
          uVar11 = 2;
          goto LAB_00207349;
        case 8:
switchD_002077ae_caseD_8:
          uVar11 = 2;
LAB_002073a6:
          printBranchOperand(MI,uVar11,O);
          break;
        case 9:
switchD_002077ae_caseD_9:
          printAbsBranchOperand(MI,2,O);
          break;
        default:
          printOperand(MI,2,O);
LAB_0020780d:
          if ((uVar6 & 0x10) == 0) {
            return;
          }
          SStream_concat0(O,", ");
          switch(uVar6 >> 5 & 7) {
          case 1:
            printU5ImmOperand(MI,3,O);
            if ((uVar6 >> 8 & 1) == 0) {
              return;
            }
            SStream_concat0(O,", ");
            uVar11 = 4;
            goto LAB_00207775;
          case 2:
            uVar11 = 3;
LAB_00207349:
            printOperand(MI,uVar11,O);
            break;
          case 3:
            uVar11 = 3;
LAB_00207886:
            printU2ImmOperand(MI,uVar11,O);
            break;
          case 4:
            uVar11 = 3;
LAB_002074e6:
            printU12ImmOperand(MI,uVar11,O);
            break;
          default:
            uVar11 = 3;
LAB_0020775e:
            printU6ImmOperand(MI,uVar11,O);
          }
        }
        goto switchD_00207145_default;
      }
LAB_00207775:
      printU5ImmOperand(MI,uVar11,O);
    }
    goto switchD_00207145_default;
  }
  SStream_concat0(O,pcVar22);
  printPredicateOperand(MI,uVar12,(SStream *)0x5387dd,(char *)Modifier);
  SStream_concat0(O," ");
  printPredicateOperand(MI,uVar12,(SStream *)0x539592,(char *)Modifier);
switchD_00207145_default:
  return;
}

Assistant:

void PPC_printInst(MCInst *MI, SStream *O, void *Info)
{
	char *mnem;

	// Check for slwi/srwi mnemonics.
	if (MCInst_getOpcode(MI) == PPC_RLWINM) {
		unsigned char SH = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 2));
		unsigned char MB = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 3));
		unsigned char ME = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 4));
		bool useSubstituteMnemonic = false;

		if (SH <= 31 && MB == 0 && ME == (31-SH)) {
			SStream_concat0(O, "slwi\t");
			MCInst_setOpcodePub(MI, PPC_INS_SLWI);
			useSubstituteMnemonic = true;
		}

		if (SH <= 31 && MB == (32-SH) && ME == 31) {
			SStream_concat0(O, "srwi\t");
			MCInst_setOpcodePub(MI, PPC_INS_SRWI);
			useSubstituteMnemonic = true;
			SH = 32-SH;
		}

		if (useSubstituteMnemonic) {
			printOperand(MI, 0, O);
			SStream_concat0(O, ", ");
			printOperand(MI, 1, O);
			if (SH > HEX_THRESHOLD)
				SStream_concat(O, ", 0x%x", (unsigned int)SH);
			else
				SStream_concat(O, ", %u", (unsigned int)SH);

			if (MI->csh->detail) {
				cs_ppc *ppc = &MI->flat_insn->detail->ppc;

				ppc->operands[ppc->op_count].type = PPC_OP_IMM;
				ppc->operands[ppc->op_count].imm = SH;
				++ppc->op_count;
			}

			return;
		}
	}

	if ((MCInst_getOpcode(MI) == PPC_OR || MCInst_getOpcode(MI) == PPC_OR8) &&
			MCOperand_getReg(MCInst_getOperand(MI, 1)) == MCOperand_getReg(MCInst_getOperand(MI, 2))) {
		SStream_concat0(O, "mr\t");
		MCInst_setOpcodePub(MI, PPC_INS_MR);
		printOperand(MI, 0, O);
		SStream_concat0(O, ", ");
		printOperand(MI, 1, O);
		return;
	}

	if (MCInst_getOpcode(MI) == PPC_RLDICR) {
		unsigned char SH = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 2));
		unsigned char ME = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 3));
		// rldicr RA, RS, SH, 63-SH == sldi RA, RS, SH
		if (63-SH == ME) {
			SStream_concat0(O, "sldi\t");
			MCInst_setOpcodePub(MI, PPC_INS_SLDI);
			printOperand(MI, 0, O);
			SStream_concat0(O, ", ");
			printOperand(MI, 1, O);
			if (SH > HEX_THRESHOLD)
				SStream_concat(O, ", 0x%x", (unsigned int)SH);
			else
				SStream_concat(O, ", %u", (unsigned int)SH);

			return;
		}
	}

	if ((MCInst_getOpcode(MI) == PPC_gBC)||(MCInst_getOpcode(MI) == PPC_gBCA)||
			(MCInst_getOpcode(MI) == PPC_gBCL)||(MCInst_getOpcode(MI) == PPC_gBCLA)) {
		int64_t bd = MCOperand_getImm(MCInst_getOperand(MI, 2));
		bd = SignExtend64(bd, 14);
		MCOperand_setImm(MCInst_getOperand(MI, 2),bd);
	}

	if (isBOCTRBranch(MCInst_getOpcode(MI))) {
		if (MCOperand_isImm(MCInst_getOperand(MI,0)))
		{
			int64_t bd = MCOperand_getImm(MCInst_getOperand(MI, 0));
			bd = SignExtend64(bd, 14);
			MCOperand_setImm(MCInst_getOperand(MI, 0),bd);
		}
	}

	if ((MCInst_getOpcode(MI) == PPC_B)||(MCInst_getOpcode(MI) == PPC_BA)||
			(MCInst_getOpcode(MI) == PPC_BL)||(MCInst_getOpcode(MI) == PPC_BLA)) {
		int64_t bd = MCOperand_getImm(MCInst_getOperand(MI, 0));
		bd = SignExtend64(bd, 24);
		MCOperand_setImm(MCInst_getOperand(MI, 0),bd);
	}

	// consider our own alias instructions first
	mnem = printAliasInstrEx(MI, O, Info);
	if (!mnem)
		mnem = printAliasInstr(MI, O, Info);

	if (mnem != NULL) {
		if (strlen(mnem) > 0) {
			struct ppc_alias alias;
			// check to remove the last letter of ('.', '-', '+')
			if (mnem[strlen(mnem) - 1] == '-' || mnem[strlen(mnem) - 1] == '+' || mnem[strlen(mnem) - 1] == '.')
				mnem[strlen(mnem) - 1] = '\0';

			if (PPC_alias_insn(mnem, &alias)) {
				MCInst_setOpcodePub(MI, alias.id);
				if (MI->csh->detail) {
					MI->flat_insn->detail->ppc.bc = (ppc_bc)alias.cc;
				}
			}
		}

		cs_mem_free(mnem);
	} else
		printInstruction(MI, O, NULL);
}